

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_document_indicator(yaml_parser_t *parser,yaml_token_type_t type)

{
  yaml_token_t **tail;
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  byte *pbVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  yaml_token_t *pyVar12;
  int iVar13;
  long lStack_a0;
  yaml_mark_t start_mark;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  
  iVar11 = yaml_parser_unroll_indent(parser,-1);
  iVar13 = 0;
  if ((iVar11 != 0) && (iVar11 = yaml_parser_remove_simple_key(parser), iVar11 != 0)) {
    parser->simple_key_allowed = 0;
    sVar3 = (parser->mark).column;
    sVar9 = (parser->mark).index;
    sVar10 = (parser->mark).line;
    sVar4 = (parser->mark).index;
    (parser->mark).index = sVar4 + 1;
    sVar5 = (parser->mark).column;
    (parser->mark).column = sVar5 + 1;
    pbVar6 = (parser->buffer).pointer;
    sVar7 = parser->unread;
    parser->unread = sVar7 - 1;
    bVar2 = *pbVar6;
    lVar8 = 1;
    lStack_a0 = lVar8;
    if ((char)bVar2 < '\0') {
      if ((bVar2 & 0xe0) == 0xc0) {
        lStack_a0 = 2;
      }
      else if ((bVar2 & 0xf0) == 0xe0) {
        lStack_a0 = 3;
      }
      else {
        lStack_a0 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
    }
    pbVar1 = pbVar6 + lStack_a0;
    (parser->buffer).pointer = pbVar1;
    (parser->mark).index = sVar4 + 2;
    (parser->mark).column = sVar5 + 2;
    parser->unread = sVar7 - 2;
    bVar2 = pbVar6[lStack_a0];
    lStack_a0 = lVar8;
    if ((char)bVar2 < '\0') {
      if ((bVar2 & 0xe0) == 0xc0) {
        lStack_a0 = 2;
      }
      else if ((bVar2 & 0xf0) == 0xe0) {
        lStack_a0 = 3;
      }
      else {
        lStack_a0 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
    }
    pbVar6 = pbVar1 + lStack_a0;
    (parser->buffer).pointer = pbVar6;
    (parser->mark).index = sVar4 + 3;
    (parser->mark).column = sVar5 + 3;
    parser->unread = sVar7 - 3;
    bVar2 = pbVar1[lStack_a0];
    lStack_a0 = lVar8;
    if ((char)bVar2 < '\0') {
      if ((bVar2 & 0xe0) == 0xc0) {
        lStack_a0 = 2;
      }
      else if ((bVar2 & 0xf0) == 0xe0) {
        lStack_a0 = 3;
      }
      else {
        lStack_a0 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
    }
    (parser->buffer).pointer = pbVar6 + lStack_a0;
    sVar4 = (parser->mark).column;
    sVar5 = (parser->mark).index;
    sVar7 = (parser->mark).line;
    local_2c = (undefined4)sVar3;
    uStack_28 = (undefined4)(sVar3 >> 0x20);
    uStack_38 = (undefined4)(sVar9 >> 0x20);
    uStack_34 = (undefined4)sVar10;
    uStack_30 = (undefined4)(sVar10 >> 0x20);
    tail = &(parser->tokens).tail;
    pyVar12 = (parser->tokens).tail;
    if (pyVar12 == (parser->tokens).end) {
      iVar11 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                 &(parser->tokens).end);
      if (iVar11 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar12 = *tail;
    }
    *tail = pyVar12 + 1;
    pyVar12->type = type;
    *(undefined8 *)&pyVar12->field_0x4 = 0;
    *(undefined8 *)((long)&(pyVar12->data).alias.value + 4) = 0;
    *(undefined8 *)((long)&(pyVar12->data).tag.suffix + 4) = 0;
    *(size_t *)((long)&pyVar12->data + 0x14) = sVar9 << 0x20;
    *(ulong *)((long)&(pyVar12->start_mark).index + 4) = CONCAT44(uStack_34,uStack_38);
    *(ulong *)((long)&(pyVar12->start_mark).line + 4) = CONCAT44(local_2c,uStack_30);
    *(undefined4 *)((long)&(pyVar12->start_mark).column + 4) = uStack_28;
    (pyVar12->end_mark).index = sVar5;
    (pyVar12->end_mark).line = sVar7;
    (pyVar12->end_mark).column = sVar4;
    iVar13 = 1;
  }
  return iVar13;
}

Assistant:

static int
yaml_parser_fetch_document_indicator(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset the indentation level. */

    if (!yaml_parser_unroll_indent(parser, -1))
        return 0;

    /* Reset simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    parser->simple_key_allowed = 0;

    /* Consume the token. */

    start_mark = parser->mark;

    SKIP(parser);
    SKIP(parser);
    SKIP(parser);

    end_mark = parser->mark;

    /* Create the DOCUMENT-START or DOCUMENT-END token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}